

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
          (cmExportBuildAndroidMKGenerator *this,cmGeneratorTarget *target,ostream *os,
          ImportPropertyMap *properties,GenerateType type,string *config)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *this_01;
  pointer pcVar1;
  undefined8 uVar2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  TargetType TVar7;
  string *psVar8;
  ostream *poVar9;
  cmGeneratorTarget *pcVar10;
  cmLinkInterfaceLibraries *pcVar11;
  _Rb_tree_node_base *p_Var12;
  cmLinkImplementation *pcVar13;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  _Base_ptr p_Var15;
  pointer this_02;
  char *pcVar16;
  undefined4 in_register_00000084;
  _func_int **pp_Var17;
  string *i;
  pointer pbVar18;
  _Rb_tree_node_base *p_Var19;
  bool bVar20;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view glue;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  cmList linkFlagsList;
  cmList includeList;
  ostringstream w;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  int local_1e4;
  undefined1 local_1e0 [17];
  undefined7 uStack_1cf;
  string *local_1c0;
  _Rb_tree_node_base *local_1b8;
  cmGeneratorTarget *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1c0 = (string *)CONCAT44(in_register_00000084,type);
  local_1e4 = (int)properties;
  this_00 = &this[5].super_cmExportBuildFileGenerator.super_cmExportFileGenerator.MissingTargets;
  PVar5 = cmPolicies::PolicyMap::Get((PolicyMap *)this_00,CMP0022);
  if ((PVar5 == WARN) ||
     (PVar5 = cmPolicies::PolicyMap::Get((PolicyMap *)this_00,CMP0022), PVar5 == OLD)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar16 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (local_1e4 == 0) {
      pcVar16 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar16,(ulong)(local_1e4 != 0) + 0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," set to OLD for target ",0x17);
    psVar8 = cmTarget::GetName_abi_cxx11_
                       ((cmTarget *)
                        (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.
                        _vptr_cmExportFileGenerator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"The export will only work with CMP0022 set to NEW.",0x32);
    this_01 = (cmMakefile *)
              (this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace.
              _M_dataplus._M_p;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this_01,AUTHOR_WARNING,(string *)local_228);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_228 + 0x10)) {
      operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  if (*(long *)&os->field_0x28 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)target,"LOCAL_CPP_FEATURES := rtti exceptions\n",0x26);
    p_Var12 = *(_Rb_tree_node_base **)&os->field_0x18;
    p_Var19 = (_Rb_tree_node_base *)&os->field_0x8;
    p_Var3 = p_Var19;
    pcVar10 = (cmGeneratorTarget *)this;
    if (p_Var12 != p_Var19) {
      do {
        local_1b0 = pcVar10;
        local_1b8 = p_Var3;
        pp_Var17 = (_func_int **)(local_1a8 + 0x10);
        p_Var3 = p_Var12 + 1;
        iVar6 = std::__cxx11::string::compare((char *)p_Var3);
        if (iVar6 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)target,"LOCAL_CPP_FEATURES += ",0x16);
          pcVar16 = *(char **)(p_Var12 + 2);
          p_Var15 = p_Var12[2]._M_parent;
          pcVar10 = target;
LAB_004956de:
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)pcVar10,pcVar16,(long)p_Var15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)p_Var3);
          if (iVar6 == 0) {
            local_1a8._8_8_ = 0;
            local_198[0]._M_local_buf[0] = '\0';
            local_228._0_8_ = local_228 + 0x10;
            local_228._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_228[0x10] = '\0';
            local_1e0._0_8_ = local_1e0 + 0x10;
            local_1e0._8_8_ = (pointer)0x0;
            local_1e0[0x10] = 0;
            local_1a8._0_8_ = pp_Var17;
            pcVar11 = cmGeneratorTarget::GetLinkInterfaceLibraries
                                ((cmGeneratorTarget *)this,local_1c0,(cmGeneratorTarget *)this,Link)
            ;
            pcVar1 = (pcVar11->Libraries).
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (this_02 = (pcVar11->Libraries).
                           super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                           super__Vector_impl_data._M_start; this_02 != pcVar1;
                this_02 = this_02 + 1) {
              pcVar10 = this_02->Target;
              psVar8 = cmLinkItem::AsStr_abi_cxx11_(this_02);
              if (pcVar10 == (cmGeneratorTarget *)0x0) {
                if (local_1e4 == 1) {
                  local_208._8_8_ = (psVar8->_M_dataplus)._M_p;
                  local_208._M_allocated_capacity = psVar8->_M_string_length;
                  __str._M_str = "../";
                  __str._M_len = 3;
                  iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,
                                     0,3,__str);
                  bVar20 = iVar6 == 0;
                }
                else {
                  bVar20 = false;
                }
                bVar4 = cmsys::SystemTools::FileIsFullPath(psVar8);
                if (bVar4) {
LAB_00495843:
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_208," ",psVar8);
                  std::__cxx11::string::_M_append(local_1e0,local_208._M_allocated_capacity);
                  goto LAB_004958c9;
                }
                local_208._8_8_ = (psVar8->_M_dataplus)._M_p;
                local_208._M_allocated_capacity = psVar8->_M_string_length;
                __str_00._M_str = "-l";
                __str_00._M_len = 2;
                iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_208,0,
                                   2,__str_00);
                if (!(bool)(~bVar20 & iVar6 != 0)) goto LAB_00495843;
                if (psVar8->_M_string_length != 0) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_208," -l",psVar8);
                  std::__cxx11::string::_M_append(local_1e0,local_208._M_allocated_capacity);
                  goto LAB_004958c9;
                }
              }
              else {
                TVar7 = cmGeneratorTarget::GetType(pcVar10);
                if ((TVar7 == SHARED_LIBRARY) ||
                   (TVar7 = cmGeneratorTarget::GetType(pcVar10), TVar7 == MODULE_LIBRARY)) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_208," ",psVar8);
                  std::__cxx11::string::_M_append(local_228,local_208._M_allocated_capacity);
                }
                else {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_208," ",psVar8);
                  std::__cxx11::string::_M_append(local_1a8,local_208._M_allocated_capacity);
                }
LAB_004958c9:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_208._M_allocated_capacity != &local_1f8) {
                  operator_delete((void *)local_208._M_allocated_capacity,
                                  local_1f8._M_allocated_capacity + 1);
                }
              }
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)target,"LOCAL_SHARED_LIBRARIES :=",0x19);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)target,(char *)local_228._0_8_,local_228._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            if (local_1a8._8_8_ != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)target,"LOCAL_STATIC_LIBRARIES :=",0x19);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)target,(char *)local_1a8._0_8_,local_1a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            if ((pointer)local_1e0._8_8_ != (pointer)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)target,"LOCAL_EXPORT_LDLIBS :=",0x16);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)target,(char *)local_1e0._0_8_,local_1e0._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            this = (cmExportBuildAndroidMKGenerator *)local_1b0;
            p_Var19 = local_1b8;
            if ((pointer)local_1e0._0_8_ != (pointer)(local_1e0 + 0x10)) {
              operator_delete((void *)local_1e0._0_8_,CONCAT71(uStack_1cf,local_1e0[0x10]) + 1);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1
                             );
            }
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)p_Var3);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)p_Var3);
              if (iVar6 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)target,"# ",2);
                pcVar10 = (cmGeneratorTarget *)
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)target,*(char **)(p_Var12 + 1),
                                     (long)p_Var12[1]._M_parent);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar10," ",1);
                pcVar16 = *(char **)(p_Var12 + 2);
                p_Var15 = p_Var12[2]._M_parent;
                goto LAB_004956de;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)target,"LOCAL_EXPORT_LDFLAGS := ",0x18);
              local_1a8._0_8_ = pp_Var17;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a8,*(long *)(p_Var12 + 2),
                         (long)&(p_Var12[2]._M_parent)->_M_color + *(long *)(p_Var12 + 2));
              init_00._M_len = 1;
              init_00._M_array = (iterator)local_1a8;
              cmList::cmList((cmList *)local_228,init_00);
              if ((_func_int **)local_1a8._0_8_ != pp_Var17) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                         local_198[0]._M_local_buf[0]) + 1);
              }
              if (local_228._8_8_ == local_228._0_8_) {
                local_1a8._8_8_ = 0;
                local_198[0]._M_local_buf[0] = '\0';
                local_1a8._0_8_ = pp_Var17;
              }
              else {
                glue._M_str = (char *)config;
                glue._M_len = (size_t)" ";
                cmList::
                Join<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((string *)local_1a8,(cmList *)local_228._0_8_,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_228._8_8_,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )0x1,glue);
              }
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)target,(char *)local_1a8._0_8_,local_1a8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if ((_func_int **)local_1a8._0_8_ != pp_Var17) {
                operator_delete((void *)local_1a8._0_8_,
                                CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                         local_198[0]._M_local_buf[0]) + 1);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_228);
              goto LAB_00495c5c;
            }
            local_1a8._0_8_ = pp_Var17;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,*(long *)(p_Var12 + 2),
                       (long)&(p_Var12[2]._M_parent)->_M_color + *(long *)(p_Var12 + 2));
            local_228._0_8_ = local_228 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_228,local_1a8._0_8_,
                       (char *)(local_1a8._0_8_ + local_1a8._8_8_));
            init._M_len = 1;
            init._M_array = (iterator)local_228;
            cmList::cmList((cmList *)local_1e0,init);
            if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
              operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)target,"LOCAL_EXPORT_C_INCLUDES := ",0x1b);
            uVar2 = local_1e0._8_8_;
            local_228._0_8_ = local_228 + 0x10;
            local_228._8_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_228[0x10] = '\0';
            for (pbVar18 = (pointer)local_1e0._0_8_; pbVar18 != (pointer)uVar2;
                pbVar18 = pbVar18 + 1) {
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)target,(char *)local_228._0_8_,local_228._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,(pbVar18->_M_dataplus)._M_p,pbVar18->_M_string_length);
              std::__cxx11::string::_M_replace((ulong)local_228,0,(char *)local_228._8_8_,0x8af8df);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)target,"\n",1);
            p_Var19 = local_1b8;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,CONCAT71(local_228._17_7_,local_228[0x10]) + 1
                             );
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e0);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,
                            CONCAT71(local_198[0]._M_allocated_capacity._1_7_,
                                     local_198[0]._M_local_buf[0]) + 1);
          }
        }
LAB_00495c5c:
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        p_Var3 = local_1b8;
        pcVar10 = local_1b0;
      } while (p_Var12 != p_Var19);
    }
  }
  TVar7 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
  if (TVar7 == STATIC_LIBRARY) {
    pcVar13 = cmGeneratorTarget::GetLinkImplementation((cmGeneratorTarget *)this,local_1c0,Link);
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[4]>>
                       ((pcVar13->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (pcVar13->Languages).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,"CXX");
    if (_Var14._M_current !=
        (pcVar13->Languages).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)target,"LOCAL_HAS_CPP := true\n",0x16);
    }
  }
  TVar7 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
  if (TVar7 - STATIC_LIBRARY < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)target,
               &DAT_0086a680 + *(int *)(&DAT_0086a680 + (ulong)(TVar7 - STATIC_LIBRARY) * 4),0x23);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)target,"\n",1);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(
            config, target, cmGeneratorTarget::LinkInterfaceFor::Link);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = cmHasLiteralPrefix(lib, "../");
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                cmHasLiteralPrefix(lib, "-l") || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        cmList includeList{ includes };
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        cmList linkFlagsList{ property.second };
        os << linkFlagsList.join(" ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(
      config, cmGeneratorTarget::LinkInterfaceFor::Link);
    if (cm::contains(li->Languages, "CXX")) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}